

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

uchar * cppcms::b64url::encode(uchar *begin,uchar *end,uchar *target)

{
  size_t sVar1;
  uchar *in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  uchar *local_18;
  uchar *local_8;
  
  local_18 = in_RDX;
  for (local_8 = in_RDI; 2 < (long)in_RSI - (long)local_8; local_8 = local_8 + 3) {
    anon_unknown.dwarf_eef4d::bencode(local_8,local_18,3);
    local_18 = local_18 + 4;
  }
  if (in_RSI != local_8) {
    sVar1 = anon_unknown.dwarf_eef4d::bencode(local_8,local_18,(long)in_RSI - (long)local_8);
    local_18 = local_18 + sVar1;
  }
  return local_18;
}

Assistant:

unsigned char *encode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=3) {
		bencode(begin,target,3);
		begin += 3;
		target += 4;
	}
	if(end!=begin)
		target+=bencode(begin,target,end-begin);
	return target;
}